

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_Flush>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_Flush> *this,
          CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_Flush> *other)

{
  GetAsyncCommandResponse_Flush *this_00;
  CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_Flush> *other_local;
  CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_Flush> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::GetAsyncCommandResponse_Flush,_std::default_delete<perfetto::protos::gen::GetAsyncCommandResponse_Flush>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (GetAsyncCommandResponse_Flush *)operator_new(0x50);
  perfetto::protos::gen::GetAsyncCommandResponse_Flush::GetAsyncCommandResponse_Flush(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::GetAsyncCommandResponse_Flush,_std::default_delete<perfetto::protos::gen::GetAsyncCommandResponse_Flush>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }